

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_diag_gen(REF_INT n,REF_DBL *a,REF_DBL *values,REF_DBL *vectors)

{
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  REF_STATUS RVar6;
  REF_DBL *ab;
  double *__ptr;
  REF_DBL *a_00;
  REF_DBL *q;
  REF_DBL *r;
  REF_DBL *pRVar7;
  int cols;
  undefined8 uVar8;
  REF_DBL *pRVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  double *pdVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  REF_DBL *local_80;
  
  cols = n + 1;
  if (cols * n < 0) {
    pcVar14 = "malloc ab of REF_DBL negative";
    uVar8 = 0x418;
LAB_001b4415:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",uVar8,
           "ref_matrix_diag_gen",pcVar14);
    RVar6 = 1;
  }
  else {
    ab = (REF_DBL *)malloc((ulong)(uint)(cols * n) << 3);
    if (ab == (REF_DBL *)0x0) {
      pcVar14 = "malloc ab of REF_DBL NULL";
      uVar8 = 0x418;
    }
    else {
      sVar1 = (ulong)(uint)(n * n) * 8;
      __ptr = (double *)malloc(sVar1);
      if (__ptr == (double *)0x0) {
        pcVar14 = "malloc qq of REF_DBL NULL";
        uVar8 = 0x419;
      }
      else {
        a_00 = (REF_DBL *)malloc(sVar1);
        if (a_00 == (REF_DBL *)0x0) {
          pcVar14 = "malloc rq of REF_DBL NULL";
          uVar8 = 0x41a;
        }
        else {
          q = (REF_DBL *)malloc(sVar1);
          if (q == (REF_DBL *)0x0) {
            pcVar14 = "malloc q of REF_DBL NULL";
            uVar8 = 0x41b;
          }
          else {
            r = (REF_DBL *)malloc(sVar1);
            if (r != (REF_DBL *)0x0) {
              uVar2 = (ulong)(uint)n;
              if (0 < n) {
                uVar12 = 0;
                uVar16 = uVar2;
                do {
                  memcpy(a_00 + uVar12,a + uVar12,uVar2 * 8);
                  uVar12 = (ulong)(uint)((int)uVar12 + n);
                  uVar16 = uVar16 - 1;
                } while (uVar16 != 0);
              }
              if (0 < n) {
                uVar12 = 0;
                uVar16 = uVar2;
                do {
                  memset(vectors + uVar12,0,uVar2 * 8);
                  uVar12 = (ulong)(uint)((int)uVar12 + n);
                  uVar16 = uVar16 - 1;
                } while (uVar16 != 0);
              }
              if (0 < n) {
                iVar3 = 0;
                uVar16 = uVar2;
                do {
                  vectors[iVar3] = 1.0;
                  iVar3 = iVar3 + cols;
                  uVar16 = uVar16 - 1;
                } while (uVar16 != 0);
              }
              sVar1 = uVar2 * 8;
              dVar19 = 1.0;
              iVar3 = 0;
              do {
                if (dVar19 <= 1e-13) goto LAB_001b4143;
                uVar4 = ref_matrix_qr(n,n,a_00,q,r);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c"
                         ,0x42a,"ref_matrix_diag_gen",(ulong)uVar4);
                  return uVar4;
                }
                if (0 < n) {
                  uVar16 = 0;
                  pRVar7 = q;
                  do {
                    uVar12 = 0;
                    pRVar9 = r;
                    do {
                      a_00[uVar16 * uVar2 + uVar12] = 0.0;
                      dVar19 = 0.0;
                      lVar15 = 0;
                      pdVar10 = pRVar9;
                      do {
                        dVar19 = dVar19 + *pdVar10 * *(double *)((long)pRVar7 + lVar15);
                        lVar15 = lVar15 + 8;
                        pdVar10 = pdVar10 + uVar2;
                      } while (sVar1 - lVar15 != 0);
                      a_00[uVar16 * uVar2 + uVar12] = dVar19;
                      uVar12 = uVar12 + 1;
                      pRVar9 = pRVar9 + 1;
                    } while (uVar12 != uVar2);
                    uVar16 = uVar16 + 1;
                    pRVar7 = pRVar7 + uVar2;
                  } while (uVar16 != uVar2);
                }
                if (0 < n) {
                  lVar15 = 0;
                  uVar16 = uVar2;
                  do {
                    memcpy((void *)((long)__ptr + lVar15),(void *)((long)vectors + lVar15),sVar1);
                    lVar15 = lVar15 + sVar1;
                    uVar16 = uVar16 - 1;
                  } while (uVar16 != 0);
                }
                if (0 < n) {
                  uVar16 = 0;
                  pRVar7 = q;
                  do {
                    uVar12 = 0;
                    pdVar10 = __ptr;
                    do {
                      vectors[uVar16 * uVar2 + uVar12] = 0.0;
                      dVar19 = 0.0;
                      lVar15 = 0;
                      pdVar13 = pdVar10;
                      do {
                        dVar19 = dVar19 + *pdVar13 * *(double *)((long)pRVar7 + lVar15);
                        lVar15 = lVar15 + 8;
                        pdVar13 = pdVar13 + uVar2;
                      } while (sVar1 - lVar15 != 0);
                      vectors[uVar16 * uVar2 + uVar12] = dVar19;
                      uVar12 = uVar12 + 1;
                      pdVar10 = pdVar10 + 1;
                    } while (uVar12 != uVar2);
                    uVar16 = uVar16 + 1;
                    pRVar7 = pRVar7 + uVar2;
                  } while (uVar16 != uVar2);
                }
                dVar17 = 0.0;
                dVar19 = 0.0;
                if (0 < n) {
                  uVar12 = 0;
                  uVar16 = uVar2;
                  pRVar7 = a_00;
                  do {
                    uVar12 = uVar12 + 1;
                    if ((long)uVar12 < (long)n) {
                      uVar11 = 1;
                      do {
                        dVar18 = pRVar7[uVar11];
                        if (dVar18 <= -dVar18) {
                          dVar18 = -dVar18;
                        }
                        if (dVar19 <= dVar18) {
                          dVar19 = dVar18;
                        }
                        uVar11 = uVar11 + 1;
                      } while (uVar16 != uVar11);
                    }
                    pRVar7 = pRVar7 + uVar2 + 1;
                    uVar16 = uVar16 - 1;
                  } while (uVar12 != uVar2);
                }
                if (0 < n) {
                  dVar17 = 0.0;
                  iVar5 = 0;
                  uVar16 = uVar2;
                  do {
                    dVar18 = a_00[iVar5];
                    if (dVar18 <= -dVar18) {
                      dVar18 = -dVar18;
                    }
                    dVar17 = dVar17 + dVar18;
                    iVar5 = iVar5 + cols;
                    uVar16 = uVar16 - 1;
                  } while (uVar16 != 0);
                }
                dVar19 = dVar19 / dVar17;
                iVar3 = iVar3 + 1;
              } while (iVar3 != 0x7a121);
              if (0 < n) {
                iVar3 = 0;
                uVar16 = 0;
                do {
                  values[uVar16] = a_00[iVar3];
                  uVar16 = uVar16 + 1;
                  iVar3 = iVar3 + cols;
                } while (uVar2 != uVar16);
              }
              ref_matrix_show_eig(n,a,values,vectors);
              printf("conv before shift %e used %d\n",dVar19,0x7a121);
LAB_001b4143:
              if (0 < n) {
                iVar3 = 0;
                uVar16 = 0;
                do {
                  values[uVar16] = a_00[iVar3];
                  uVar16 = uVar16 + 1;
                  iVar3 = iVar3 + cols;
                } while (uVar2 != uVar16);
              }
              if (0 < n) {
                pRVar7 = ab + (uint)(n * n);
                uVar16 = 0;
                local_80 = vectors;
                do {
                  uVar4 = 0;
                  dVar19 = 1.0;
                  do {
                    if (dVar19 <= 1e-13) goto LAB_001b43a8;
                    uVar4 = uVar4 + 1;
                    lVar15 = 0;
                    uVar12 = uVar2;
                    do {
                      memcpy((void *)((long)ab + lVar15),(void *)((long)a + lVar15),sVar1);
                      lVar15 = lVar15 + sVar1;
                      uVar12 = uVar12 - 1;
                    } while (uVar12 != 0);
                    dVar17 = values[uVar16];
                    iVar3 = 0;
                    uVar12 = uVar2;
                    do {
                      ab[iVar3] = dVar17 * -1.0001 + ab[iVar3];
                      iVar3 = iVar3 + cols;
                      uVar12 = uVar12 - 1;
                    } while (uVar12 != 0);
                    memcpy(pRVar7,vectors + (uint)((int)uVar16 * n),sVar1);
                    RVar6 = ref_matrix_solve_ab(n,cols,ab);
                    if (RVar6 != 0) {
                      ref_matrix_show_ab(n,cols,ab);
                      ref_matrix_show_eig(n,a,values,vectors);
                      printf("vectr %d conv %e used %d\n",dVar19,uVar16,(ulong)uVar4);
                      pcVar14 = "solve";
                      uVar8 = 0x452;
                      goto LAB_001b4415;
                    }
                    dVar19 = 0.0;
                    uVar12 = 0;
                    do {
                      dVar19 = dVar19 + pRVar7[uVar12] * pRVar7[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar2 != uVar12);
                    if (dVar19 < 0.0) {
                      dVar19 = sqrt(dVar19);
                    }
                    else {
                      dVar19 = SQRT(dVar19);
                    }
                    dVar17 = dVar19 * 1e+20;
                    if (dVar17 <= -dVar17) {
                      dVar17 = -dVar17;
                    }
                    uVar12 = 0;
                    do {
                      dVar18 = pRVar7[uVar12];
                      dVar20 = dVar18;
                      if (dVar18 <= -dVar18) {
                        dVar20 = -dVar18;
                      }
                      if (dVar17 <= dVar20) {
                        return 4;
                      }
                      pRVar7[uVar12] = dVar18 / dVar19;
                      uVar12 = uVar12 + 1;
                    } while (uVar2 != uVar12);
                    dVar19 = 0.0;
                    uVar12 = 0;
                    do {
                      dVar19 = dVar19 + (local_80[uVar12] - pRVar7[uVar12]) *
                                        (local_80[uVar12] - pRVar7[uVar12]);
                      uVar12 = uVar12 + 1;
                    } while (uVar2 != uVar12);
                    dVar17 = 0.0;
                    uVar12 = 0;
                    do {
                      dVar17 = dVar17 + (local_80[uVar12] + pRVar7[uVar12]) *
                                        (local_80[uVar12] + pRVar7[uVar12]);
                      uVar12 = uVar12 + 1;
                    } while (uVar2 != uVar12);
                    if (dVar17 <= dVar19) {
                      dVar19 = dVar17;
                    }
                    memcpy(vectors + (uint)((int)uVar16 * n),pRVar7,sVar1);
                  } while (uVar4 != 0x186a1);
                  printf("vectr %d conv %e used %d\n",dVar19,uVar16,0x186a1);
LAB_001b43a8:
                  uVar16 = uVar16 + 1;
                  local_80 = local_80 + uVar2;
                } while (uVar16 != uVar2);
              }
              free(r);
              free(q);
              free(a_00);
              free(__ptr);
              free(ab);
              return 0;
            }
            pcVar14 = "malloc r of REF_DBL NULL";
            uVar8 = 0x41c;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",uVar8,
           "ref_matrix_diag_gen",pcVar14);
    RVar6 = 2;
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_diag_gen(REF_INT n, REF_DBL *a, REF_DBL *values,
                                       REF_DBL *vectors) {
  REF_DBL *q, *r, *rq, *qq, *ab;
  REF_INT i, j, k, iter;
  REF_DBL max_lower, trace, conv, convm;
  REF_DBL len;

  ref_malloc(ab, n * (n + 1), REF_DBL);
  ref_malloc(qq, n * n, REF_DBL);
  ref_malloc(rq, n * n, REF_DBL);
  ref_malloc(q, n * n, REF_DBL);
  ref_malloc(r, n * n, REF_DBL);

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) rq[i + j * n] = a[i + j * n];

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) vectors[i + j * n] = 0.0;
  for (i = 0; i < n; i++) vectors[i + i * n] = 1.0;

  iter = 0;
  conv = 1.0;
  while (conv > 1.0e-13) {
    iter++;

    RSS(ref_matrix_qr(n, n, rq, q, r), "qr");
    ref_matrix_mult_gen(n, r, q, rq);

    for (j = 0; j < n; j++)
      for (i = 0; i < n; i++) qq[i + j * n] = vectors[i + j * n];
    ref_matrix_mult_gen(n, qq, q, vectors);

    max_lower = 0.0;
    for (j = 0; j < n; j++)
      for (i = j + 1; i < n; i++)
        max_lower = MAX(max_lower, ABS(rq[i + j * n]));
    trace = 0.0;
    for (i = 0; i < n; i++) trace += ABS(rq[i + i * n]);
    conv = max_lower / trace;

    if (iter > 500000) {
      for (i = 0; i < n; i++) values[i] = rq[i + i * n];
      RSS(ref_matrix_show_eig(n, a, values, vectors), "show");
      printf("conv before shift %e used %d\n", conv, iter);
      break;
    }
  }

  for (i = 0; i < n; i++) values[i] = rq[i + i * n];

  for (k = 0; k < n; k++) {
    iter = 0;
    conv = 1.0;
    while (conv > 1.0e-13) {
      iter++;
      for (j = 0; j < n; j++)
        for (i = 0; i < n; i++) ab[i + j * n] = a[i + j * n];
      for (i = 0; i < n; i++) ab[i + i * n] -= 1.0001 * values[k];

      for (i = 0; i < n; i++) ab[i + n * n] = vectors[i + k * n];

      if (REF_SUCCESS != ref_matrix_solve_ab(n, n + 1, ab)) {
        ref_matrix_show_ab(n, n + 1, ab);
        ref_matrix_show_eig(n, a, values, vectors);
        printf("vectr %d conv %e used %d\n", k, conv, iter);
        THROW("solve");
      }

      len = 0.0;
      for (i = 0; i < n; i++) len += ab[i + n * n] * ab[i + n * n];
      len = sqrt(len);
      for (i = 0; i < n; i++) {
        if (!ref_math_divisible(ab[i + n * n], len)) return REF_DIV_ZERO;
        ab[i + n * n] = ab[i + n * n] / len;
      }

      conv = 0.0;
      for (i = 0; i < n; i++)
        conv += (vectors[i + k * n] - ab[i + n * n]) *
                (vectors[i + k * n] - ab[i + n * n]);
      convm = 0.0;
      for (i = 0; i < n; i++)
        convm += (vectors[i + k * n] + ab[i + n * n]) *
                 (vectors[i + k * n] + ab[i + n * n]);

      conv = MIN(conv, convm);

      for (i = 0; i < n; i++) vectors[i + k * n] = ab[i + n * n];

      if (iter > 100000) {
        printf("vectr %d conv %e used %d\n", k, conv, iter);
        break;
      }
    }
  }

  ref_free(r);
  ref_free(q);
  ref_free(rq);
  ref_free(qq);
  ref_free(ab);

  return REF_SUCCESS;
}